

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O0

int check_7zip_header_in_sfx(char *p)

{
  char cVar1;
  int iVar2;
  uint32_t uVar3;
  uLong uVar4;
  char *p_local;
  
  cVar1 = p[5];
  if (cVar1 == '\x1c') {
    iVar2 = memcmp(p,anon_var_dwarf_c4bca4,6);
    if (iVar2 == 0) {
      uVar4 = cm_zlib_crc32(0,(uchar *)(p + 0xc),0x14);
      uVar3 = archive_le32dec(p + 8);
      if (uVar4 == uVar3) {
        p_local._4_4_ = 0;
      }
      else {
        p_local._4_4_ = 6;
      }
    }
    else {
      p_local._4_4_ = 6;
    }
  }
  else if (cVar1 == '\'') {
    p_local._4_4_ = 1;
  }
  else if (cVar1 == '7') {
    p_local._4_4_ = 5;
  }
  else if (cVar1 == 'z') {
    p_local._4_4_ = 4;
  }
  else if (cVar1 == -0x51) {
    p_local._4_4_ = 2;
  }
  else if (cVar1 == -0x44) {
    p_local._4_4_ = 3;
  }
  else {
    p_local._4_4_ = 6;
  }
  return p_local._4_4_;
}

Assistant:

static int
check_7zip_header_in_sfx(const char *p)
{
	switch ((unsigned char)p[5]) {
	case 0x1C:
		if (memcmp(p, _7ZIP_SIGNATURE, 6) != 0)
			return (6);
		/*
		 * Test the CRC because its extraction code has 7-Zip
		 * Magic Code, so we should do this in order not to
		 * make a mis-detection.
		 */
		if (crc32(0, (const unsigned char *)p + 12, 20)
			!= archive_le32dec(p + 8))
			return (6);
		/* Hit the header! */
		return (0);
	case 0x37: return (5);
	case 0x7A: return (4);
	case 0xBC: return (3);
	case 0xAF: return (2);
	case 0x27: return (1);
	default: return (6);
	}
}